

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall mario::EventLoop::queueInLoop(EventLoop *this,Functor *cb)

{
  bool bVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
            (&this->_pendingFunctors,cb);
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  bVar1 = isInLoopThread(this);
  if ((bVar1) && (this->_callingPendingFunctors != true)) {
    return;
  }
  wakeup(this);
  return;
}

Assistant:

void EventLoop::queueInLoop(const Functor& cb) {
    {
        MutexLockGuard lock(_mutex);
        _pendingFunctors.push_back(cb);
    }

    if (!isInLoopThread() || _callingPendingFunctors) {
        wakeup();
    }
}